

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

double matd_det(matd_t *a)

{
  matd_t mVar1;
  matd_t mVar2;
  matd_t mVar3;
  matd_t mVar4;
  matd_t mVar5;
  matd_t mVar6;
  matd_t mVar7;
  matd_t mVar8;
  matd_t mVar9;
  matd_t mVar10;
  matd_t mVar11;
  matd_t mVar12;
  matd_t mVar13;
  matd_t mVar14;
  matd_t mVar15;
  int iVar16;
  ulong uVar17;
  matd_plu_t *mlu;
  matd_t *m;
  matd_t *m_00;
  uint uVar18;
  double dVar19;
  double dVar20;
  matd_t mVar21;
  double local_68;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1a6,"double matd_det(const matd_t *)");
  }
  uVar18 = a->ncols;
  uVar17 = (ulong)uVar18;
  if (a->nrows != uVar18) {
    __assert_fail("a->nrows == a->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1a7,"double matd_det(const matd_t *)");
  }
  switch(a->nrows) {
  case 0:
    __assert_fail("a->nrows > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x1ac,"double matd_det(const matd_t *)");
  case 1:
    mVar21 = a[1];
    break;
  case 2:
    dVar20 = (double)a[3] * (double)a[2];
    dVar19 = (double)a[1] * (double)a[4];
    goto LAB_003fb41a;
  case 3:
    dVar19 = (double)a[4] * (double)a[3] * (double)a[8] +
             (((double)a[6] * (double)a[2] * (double)a[7] +
              ((double)a[1] * (double)a[5] * (double)a[9] -
              (double)a[6] * (double)a[1] * (double)a[8])) -
             (double)a[2] * (double)a[4] * (double)a[9]);
    dVar20 = (double)a[5] * (double)a[3] * (double)a[7];
LAB_003fb41a:
    mVar21 = (matd_t)(dVar19 - dVar20);
    break;
  case 4:
    mVar21 = a[1];
    mVar1 = a[2];
    mVar2 = a[3];
    mVar3 = a[uVar17 + 1];
    mVar4 = a[(ulong)(uVar18 + 1) + 1];
    mVar5 = a[(ulong)(uVar18 + 2) + 1];
    mVar6 = a[(ulong)(uVar18 * 2 + 2) + 1];
    mVar7 = a[(ulong)(uVar18 * 2 + 3) + 1];
    mVar8 = a[(uVar17 * 3 + 1 & 0xffffffff) + 1];
    mVar9 = a[(ulong)(uVar18 * 3) + 1];
    mVar10 = a[(uVar17 * 3 + 2 & 0xffffffff) + 1];
    mVar11 = a[(uVar17 * 3 + 3 & 0xffffffff) + 1];
    mVar12 = a[(ulong)(uVar18 * 2) + 2];
    mVar13 = a[(ulong)(uVar18 + 3) + 1];
    mVar14 = a[4];
    mVar15 = a[(ulong)(uVar18 * 2) + 1];
    mVar21 = (matd_t)((double)mVar12 * (double)mVar9 * (double)mVar14 * (double)mVar5 +
                     ((((double)mVar2 * (double)mVar4 * (double)mVar9 * (double)mVar7 +
                       (double)mVar1 * (double)mVar9 * (double)mVar13 * (double)mVar6 +
                       ((((double)mVar2 * (double)mVar15 * (double)mVar8 * (double)mVar13 +
                         (double)mVar4 * (double)mVar15 * (double)mVar14 * (double)mVar10 +
                         ((((double)mVar5 * (double)mVar1 * (double)mVar15 * (double)mVar11 +
                           (double)mVar3 * (double)mVar8 * (double)mVar14 * (double)mVar6 +
                           ((((double)mVar2 * (double)mVar3 * (double)mVar12 * (double)mVar11 +
                             (double)mVar1 * (double)mVar3 * (double)mVar7 * (double)mVar10 +
                             ((((double)mVar5 * (double)mVar21 * (double)mVar8 * (double)mVar7 +
                               (double)mVar21 * (double)mVar12 * (double)mVar13 * (double)mVar10 +
                               (((double)mVar21 * (double)mVar4 * (double)mVar6 * (double)mVar11 -
                                (double)mVar7 * (double)mVar21 * (double)mVar4 * (double)mVar10) -
                               (double)mVar5 * (double)mVar21 * (double)mVar12 * (double)mVar11)) -
                              (double)mVar21 * (double)mVar8 * (double)mVar13 * (double)mVar6) -
                             (double)mVar6 * (double)mVar1 * (double)mVar3 * (double)mVar11)) -
                            (double)mVar3 * (double)mVar12 * (double)mVar14 * (double)mVar10) -
                           (double)mVar2 * (double)mVar3 * (double)mVar8 * (double)mVar7)) -
                          (double)mVar1 * (double)mVar15 * (double)mVar13 * (double)mVar10) -
                         (double)mVar2 * (double)mVar4 * (double)mVar15 * (double)mVar11)) -
                        (double)mVar15 * (double)mVar8 * (double)mVar14 * (double)mVar5) -
                       (double)mVar5 * (double)mVar1 * (double)mVar9 * (double)mVar7)) -
                      (double)mVar4 * (double)mVar9 * (double)mVar14 * (double)mVar6) -
                     (double)mVar2 * (double)mVar12 * (double)mVar9 * (double)mVar13));
    break;
  default:
    mlu = matd_plu(a);
    m = matd_plu_l(mlu);
    m_00 = matd_plu_u(mlu);
    if (a->nrows == 0) {
      dVar19 = 1.0;
      local_68 = 1.0;
    }
    else {
      uVar18 = 0;
      dVar19 = 1.0;
      local_68 = 1.0;
      do {
        dVar20 = matd_get(m,uVar18,uVar18);
        local_68 = local_68 * dVar20;
        dVar20 = matd_get(m_00,uVar18,uVar18);
        dVar19 = dVar19 * dVar20;
        uVar18 = uVar18 + 1;
      } while (uVar18 < a->nrows);
    }
    iVar16 = mlu->pivsign;
    matd_plu_destroy(mlu);
    if (m != (matd_t *)0x0) {
      free(m);
    }
    if (m_00 != (matd_t *)0x0) {
      free(m_00);
    }
    mVar21 = (matd_t)(dVar19 * local_68 * (double)iVar16);
  }
  return (double)mVar21;
}

Assistant:

double matd_det(const matd_t *a)
{
    assert(a != NULL);
    assert(a->nrows == a->ncols);

    switch(a->nrows) {
        case 0:
            // scalar: invalid
            assert(a->nrows > 0);
            break;

        case 1:
            // 1x1 matrix
            return a->data[0];

        case 2:
            // 2x2 matrix
            return a->data[0] * a->data[3] - a->data[1] * a->data[2];

        case 3:
            // 3x3 matrix
            return  a->data[0]*a->data[4]*a->data[8]
                - a->data[0]*a->data[5]*a->data[7]
                + a->data[1]*a->data[5]*a->data[6]
                - a->data[1]*a->data[3]*a->data[8]
                + a->data[2]*a->data[3]*a->data[7]
                - a->data[2]*a->data[4]*a->data[6];

        case 4: {
            // 4x4 matrix
            double m00 = MATD_EL(a,0,0), m01 = MATD_EL(a,0,1), m02 = MATD_EL(a,0,2), m03 = MATD_EL(a,0,3);
            double m10 = MATD_EL(a,1,0), m11 = MATD_EL(a,1,1), m12 = MATD_EL(a,1,2), m13 = MATD_EL(a,1,3);
            double m20 = MATD_EL(a,2,0), m21 = MATD_EL(a,2,1), m22 = MATD_EL(a,2,2), m23 = MATD_EL(a,2,3);
            double m30 = MATD_EL(a,3,0), m31 = MATD_EL(a,3,1), m32 = MATD_EL(a,3,2), m33 = MATD_EL(a,3,3);

            return m00 * m11 * m22 * m33 - m00 * m11 * m23 * m32 -
                m00 * m21 * m12 * m33 + m00 * m21 * m13 * m32 + m00 * m31 * m12 * m23 -
                m00 * m31 * m13 * m22 - m10 * m01 * m22 * m33 +
                m10 * m01 * m23 * m32 + m10 * m21 * m02 * m33 -
                m10 * m21 * m03 * m32 - m10 * m31 * m02 * m23 +
                m10 * m31 * m03 * m22 + m20 * m01 * m12 * m33 -
                m20 * m01 * m13 * m32 - m20 * m11 * m02 * m33 +
                m20 * m11 * m03 * m32 + m20 * m31 * m02 * m13 -
                m20 * m31 * m03 * m12 - m30 * m01 * m12 * m23 +
                m30 * m01 * m13 * m22 + m30 * m11 * m02 * m23 -
                m30 * m11 * m03 * m22 - m30 * m21 * m02 * m13 +
                m30 * m21 * m03 * m12;
        }

        default:
            return matd_det_general(a);
    }

    assert(0);
    return 0;
}